

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

monst * animate_statue(obj *statue,xchar x,xchar y,int cause,int *fail_reason)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  monst *mtmp;
  char *pcVar5;
  obj *poVar6;
  permonst *ppVar7;
  bool bVar8;
  coord cc;
  char statuename [256];
  coord local_13a;
  char local_138 [264];
  
  bVar8 = true;
  if ((urole.malenum == 0x159) && (flags.mon_moving == '\0')) {
    bVar8 = (statue->spe & 1U) == 0;
  }
  pcVar4 = xname(statue);
  pcVar4 = the(pcVar4);
  strcpy(local_138,pcVar4);
  if ((statue->oxlth != 0) && ((*(uint *)&statue->field_0x4a & 0x600000) == 0x200000)) {
    local_13a.x = x;
    local_13a.y = y;
    mtmp = montraits(statue,&local_13a);
    if (mtmp == (monst *)0x0) goto LAB_00263661;
    if ((mtmp->mtame != '\0') && ((mtmp->field_0x63 & 4) == 0)) {
      wary_dog(mtmp,'\x01');
    }
    goto LAB_00263634;
  }
  ppVar7 = mons + 0x106;
  if (mons[statue->corpsenm].mlet != '7') {
    ppVar7 = mons + statue->corpsenm;
  }
  if (cause != 2) {
    ppVar7 = mons + statue->corpsenm;
  }
  if ((cause != 2) && ((ppVar7->geno & 0x1000) != 0)) {
    iVar3 = 2;
    mtmp = (monst *)0x0;
    goto LAB_002641b7;
  }
  iVar3 = 1;
  if ((cause == 2) && (((ppVar7->geno >> 0xc & 1) != 0 || (iVar3 = 0x101, ppVar7->msound == '!'))))
  {
    mtmp = makemon(mons + 0x117,level,(int)x,(int)y,0x141);
    if (mtmp == (monst *)0x0) {
LAB_00263661:
      iVar3 = 1;
      mtmp = (monst *)0x0;
      goto LAB_002641b7;
    }
    if ((*(uint *)&mtmp->field_0x60 & 0x70) == 0x20) {
      newcham(level,mtmp,ppVar7,'\0','\0');
    }
  }
  else {
    mtmp = makemon(ppVar7,level,(int)x,(int)y,iVar3);
    if (mtmp == (monst *)0x0) goto LAB_00263661;
  }
LAB_00263634:
  if (statue->owornmask != 0) {
    remove_worn_item(statue,'\x01');
  }
  if ((statue->spe & 2U) == 0) {
    if ((statue->spe & 4U) != 0) {
      mtmp->field_0x60 = mtmp->field_0x60 | 1;
    }
  }
  else {
    mtmp->field_0x60 = mtmp->field_0x60 & 0xfe;
  }
  if (statue->onamelth != '\0') {
    mtmp = christen_monst(mtmp,(char *)((long)statue->oextra + (long)statue->oxlth));
  }
  while (poVar6 = statue->cobj, poVar6 != (obj *)0x0) {
    obj_extract_self(poVar6);
    add_to_minv(mtmp,poVar6);
  }
  m_dowear(level,mtmp,'\x01');
  delobj(statue);
  if (mtmp->m_ap_type == '\0') {
    mtmp->field_0x60 = mtmp->field_0x60 & 0x7f;
  }
  else {
    seemimic(mtmp);
  }
  if (u.ux == x) {
    if ((cause == 2) || (u.uy == y)) {
LAB_0026372d:
      ppVar7 = mtmp->data;
      pcVar4 = "moves";
      if ((ppVar7->mlet != '7') &&
         (((ppVar7->mlet != '\x16' && ((ppVar7->mflags2 & 2) == 0)) &&
          (pcVar4 = "comes to life", ppVar7 == mons + 0x33)))) {
        pcVar4 = "moves";
      }
      if (cause == 2) {
        pcVar5 = upstart(local_138);
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00263dc6;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0026390f;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00263906;
          }
          else {
LAB_00263906:
            if (ublindf == (obj *)0x0) goto LAB_00263e12;
LAB_0026390f:
            if (ublindf->oartifact != '\x1d') goto LAB_00263e12;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
          goto LAB_00263dc6;
LAB_00263e12:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
              (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00263e62;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00263e5d;
            }
            else {
LAB_00263e5d:
              if (ublindf != (obj *)0x0) {
LAB_00263e62:
                if (ublindf->oartifact == '\x1d') goto LAB_00263eee;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_00263f41;
            }
LAB_00263eee:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
            goto LAB_00263f41;
          }
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0'))))
          {
            pcVar4 = "disappears";
          }
        }
        else {
          bVar2 = worm_known(level,mtmp);
          if (bVar2 == '\0') goto LAB_00263e12;
LAB_00263dc6:
          uVar1 = *(uint *)&mtmp->field_0x60;
          if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_00263e05;
            goto LAB_00263e12;
          }
          if ((uVar1 & 0x280) != 0) goto LAB_00263e12;
LAB_00263e05:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_00263e12;
        }
LAB_00263f41:
        pline("%s %s!",pcVar5,pcVar4);
      }
      else {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00263faf;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00263962;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00263959;
          }
          else {
LAB_00263959:
            if (ublindf == (obj *)0x0) goto LAB_00263ffb;
LAB_00263962:
            if (ublindf->oartifact != '\x1d') goto LAB_00263ffb;
          }
          if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
              (((youmonst.data)->mflags3 & 0x100) != 0)) &&
             (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((ppVar7->mflags3 & 0x200) != 0))))
          goto LAB_00263faf;
LAB_00263ffb:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
              (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0026404b;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00264046;
            }
            else {
LAB_00264046:
              if (ublindf != (obj *)0x0) {
LAB_0026404b:
                if (ublindf->oartifact == '\x1d') goto LAB_002640d7;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_0026412a;
            }
LAB_002640d7:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
            goto LAB_0026412a;
          }
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0'))))
          {
            pcVar4 = "disappears";
          }
        }
        else {
          bVar2 = worm_known(level,mtmp);
          if (bVar2 == '\0') goto LAB_00263ffb;
LAB_00263faf:
          uVar1 = *(uint *)&mtmp->field_0x60;
          if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_00263fee;
            goto LAB_00263ffb;
          }
          if ((uVar1 & 0x280) != 0) goto LAB_00263ffb;
LAB_00263fee:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_00263ffb;
        }
LAB_0026412a:
        pline("The statue %s!",pcVar4);
      }
      if (!bVar8) {
        pline("You feel guilty that the historic statue is now gone.");
        adjalign(-1);
      }
    }
    else {
      if (cause == 1) goto LAB_002637ae;
LAB_002637d4:
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00263bd3;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002638bd;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002638b4;
        }
        else {
LAB_002638b4:
          if (ublindf == (obj *)0x0) goto LAB_00263c1f;
LAB_002638bd:
          if (ublindf->oartifact != '\x1d') goto LAB_00263c1f;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
        goto LAB_00263bd3;
LAB_00263c1f:
        if (((mtmp->data->mflags1 & 0x10000) == 0) &&
           ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
            (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00263c6f;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00263c6a;
          }
          else {
LAB_00263c6a:
            if (ublindf != (obj *)0x0) {
LAB_00263c6f:
              if (ublindf->oartifact == '\x1d') goto LAB_00263cfb;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00263d4b;
          }
LAB_00263cfb:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
          goto LAB_00263d4b;
        }
        if ((u.uprops[0x42].intrinsic != 0) ||
           ((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(mtmp), bVar2 != '\0'))))
        goto LAB_00263d4b;
        pcVar4 = "something";
      }
      else {
        bVar2 = worm_known(level,mtmp);
        if (bVar2 == '\0') goto LAB_00263c1f;
LAB_00263bd3:
        uVar1 = *(uint *)&mtmp->field_0x60;
        if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)
           ) {
          if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_00263c12;
          goto LAB_00263c1f;
        }
        if ((uVar1 & 0x280) != 0) goto LAB_00263c1f;
LAB_00263c12:
        if ((u._1052_1_ & 0x20) != 0) goto LAB_00263c1f;
LAB_00263d4b:
        pcVar4 = a_monnam(mtmp);
      }
      pline("You find %s posing as a statue.",pcVar4);
      stop_occupation();
    }
  }
  else {
    if (cause != 1) {
      if (cause != 2) goto LAB_002637d4;
      goto LAB_0026372d;
    }
LAB_002637ae:
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002639c9;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0026386b;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00263862;
      }
      else {
LAB_00263862:
        if (ublindf == (obj *)0x0) goto LAB_00263a15;
LAB_0026386b:
        if (ublindf->oartifact != '\x1d') goto LAB_00263a15;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)
          ) && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_002639c9;
LAB_00263a15:
      if (((mtmp->data->mflags1 & 0x10000) != 0) ||
         ((poVar6 = which_armor(mtmp,4), poVar6 != (obj *)0x0 &&
          (poVar6 = which_armor(mtmp,4), poVar6->otyp == 0x4f)))) {
LAB_00263b31:
        if (u.uprops[0x42].intrinsic == 0) {
LAB_00263b3a:
          if (u.uprops[0x42].extrinsic == 0) {
            bVar2 = match_warn_of_mon(mtmp);
            pcVar4 = "comes to life";
            if (bVar2 == '\0') {
              pcVar4 = "disappears";
            }
            goto LAB_00263b4a;
          }
        }
        goto LAB_00263b43;
      }
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00263a65;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00263a60;
      }
      else {
LAB_00263a60:
        if (ublindf != (obj *)0x0) {
LAB_00263a65:
          if (ublindf->oartifact == '\x1d') goto LAB_00263af1;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00263b43;
      }
LAB_00263af1:
      if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_00263b31;
      iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
      pcVar4 = "comes to life";
      if ((0x40 < iVar3) && (u.uprops[0x42].intrinsic == 0)) goto LAB_00263b3a;
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') goto LAB_00263a15;
LAB_002639c9:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_00263a08;
        goto LAB_00263a15;
      }
      if ((uVar1 & 0x280) != 0) goto LAB_00263a15;
LAB_00263a08:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_00263a15;
LAB_00263b43:
      pcVar4 = "comes to life";
    }
LAB_00263b4a:
    pline("Instead of shattering, the statue suddenly %s!",pcVar4);
  }
  if ((((u.ux == x) && (u.uy == y)) && (u.umonnum != u.umonster)) &&
     ((((youmonst.data)->mflags1 & 0x80) != 0 && (level->objects[x][y] == (obj *)0x0)))) {
    u._1052_1_ = u._1052_1_ & 0xfb;
  }
  iVar3 = 0;
LAB_002641b7:
  if (fail_reason != (int *)0x0) {
    *fail_reason = iVar3;
  }
  return mtmp;
}

Assistant:

struct monst *animate_statue(struct obj *statue, xchar x, xchar y, int cause,
			     int *fail_reason)
{
	const struct permonst *mptr;
	struct monst *mon = 0;
	struct obj *item;
	coord cc;
	boolean historic = (Role_if (PM_ARCHEOLOGIST) && !flags.mon_moving && (statue->spe & STATUE_HISTORIC));
	char statuename[BUFSZ];

	strcpy(statuename,the(xname(statue)));

	if (statue->oxlth && statue->oattached == OATTACHED_MONST) {
	    cc.x = x,  cc.y = y;
	    mon = montraits(statue, &cc);
	    if (mon && mon->mtame && !mon->isminion)
		wary_dog(mon, TRUE);
	} else {
	    /* statue of any golem hit with stone-to-flesh becomes flesh golem */
	    if (is_golem(&mons[statue->corpsenm]) && cause == ANIMATE_SPELL)
	    	mptr = &mons[PM_FLESH_GOLEM];
	    else
		mptr = &mons[statue->corpsenm];
	    /*
	     * Guard against someone wishing for a statue of a unique monster
	     * (which is allowed in normal play) and then tossing it onto the
	     * [detected or guessed] location of a statue trap.  Normally the
	     * uppermost statue is the one which would be activated.
	     */
	    if ((mptr->geno & G_UNIQ) && cause != ANIMATE_SPELL) {
	        if (fail_reason) *fail_reason = AS_MON_IS_UNIQUE;
	        return NULL;
	    }
	    if (cause == ANIMATE_SPELL &&
		((mptr->geno & G_UNIQ) || mptr->msound == MS_GUARDIAN)) {
		/* Statues of quest guardians or unique monsters
		 * will not stone-to-flesh as the real thing.
		 */
		mon = makemon(&mons[PM_DOPPELGANGER], level, x, y,
			NO_MINVENT|MM_NOCOUNTBIRTH|MM_ADJACENTOK);
		if (mon) {
			/* makemon() will set mon->cham to
			 * CHAM_ORDINARY if hero is wearing
			 * ring of protection from shape changers
			 * when makemon() is called, so we have to
			 * check the field before calling newcham().
			 */
			if (mon->cham == CHAM_DOPPELGANGER)
				newcham(level, mon, mptr, FALSE, FALSE);
		}
	    } else
		mon = makemon(mptr, level, x, y, (cause == ANIMATE_SPELL) ?
			(NO_MINVENT | MM_ADJACENTOK) : NO_MINVENT);
	}

	if (!mon) {
	    if (fail_reason) *fail_reason = AS_NO_MON;
	    return NULL;
	}

	/* in case statue is wielded and hero zaps stone-to-flesh at self */
	if (statue->owornmask) remove_worn_item(statue, TRUE);

	/* allow statues to be of a specific gender */
	if (statue->spe & STATUE_MALE)
	    mon->female = FALSE;
	else if (statue->spe & STATUE_FEMALE)
	    mon->female = TRUE;
	/* if statue has been named, give same name to the monster */
	if (statue->onamelth)
	    mon = christen_monst(mon, ONAME(statue));
	/* transfer any statue contents to monster's inventory */
	while ((item = statue->cobj) != 0) {
	    obj_extract_self(item);
	    add_to_minv(mon, item);
	}
	m_dowear(level, mon, TRUE);
	delobj(statue);

	/* mimic statue becomes seen mimic; other hiders won't be hidden */
	if (mon->m_ap_type) seemimic(mon);
	else mon->mundetected = FALSE;
	if ((x == u.ux && y == u.uy) || cause == ANIMATE_SPELL) {
	    const char *comes_to_life = nonliving(mon->data) ?
					"moves" : "comes to life"; 
	    if (cause == ANIMATE_SPELL)
	    	pline("%s %s!", upstart(statuename),
	    		canspotmon(level, mon) ? comes_to_life : "disappears");
	    else
		pline("The statue %s!",
			canspotmon(level, mon) ? comes_to_life : "disappears");
	    if (historic) {
		    pline("You feel guilty that the historic statue is now gone.");
		    adjalign(-1);
	    }
	} else if (cause == ANIMATE_SHATTER)
	    pline("Instead of shattering, the statue suddenly %s!",
		canspotmon(level, mon) ? "comes to life" : "disappears");
	else { /* cause == ANIMATE_NORMAL */
	    pline("You find %s posing as a statue.",
		canspotmon(level, mon) ? a_monnam(mon) : "something");
	    stop_occupation();
	}
	/* avoid hiding under nothing */
	if (x == u.ux && y == u.uy &&
		Upolyd && hides_under(youmonst.data) && !OBJ_AT(x, y))
	    u.uundetected = 0;

	if (fail_reason) *fail_reason = AS_OK;
	return mon;
}